

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O2

Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
* __thiscall
wallet::ScriptPubKeyMan::GetReservedDestination
          (Result<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>
           *__return_storage_ptr__,ScriptPubKeyMan *this,OutputType type,bool internal,
          int64_t *index,CKeyPool *keypool)

{
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff78;
  bilingual_str local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff88,"Not supported",
             (allocator<char> *)&stack0xffffffffffffff87);
  Untranslated(&local_58,in_stack_ffffffffffffff78);
  std::__detail::__variant::
  _Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
  ::_Variant_storage<0ul,bilingual_str>
            ((_Variant_storage<false,bilingual_str,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>
              *)__return_storage_ptr__,&local_58);
  bilingual_str::~bilingual_str(&local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

virtual util::Result<CTxDestination> GetReservedDestination(const OutputType type, bool internal, int64_t& index, CKeyPool& keypool) { return util::Error{Untranslated("Not supported")}; }